

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O2

void CPU::WDC65816::ProcessorStorageConstructor::immediate_rep_sep
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPreviousPCThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationPerform);
  return;
}

Assistant:

static void immediate_rep_sep(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);				// IDL.
		target(CycleFetchPreviousPCThrowaway);		// "Add 1 cycle for REP and SEP"
		target(OperationPerform);
	}